

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_test.c
# Opt level: O3

void test_ipc_ping_pong_many(void)

{
  undefined4 uVar1;
  nng_err nVar2;
  int iVar3;
  nng_err nVar4;
  char *pcVar5;
  int local_88;
  char local_84;
  char buf_ [64];
  size_t local_40;
  size_t sz_;
  nng_socket s0;
  nng_socket s1;
  
  nuts_scratch_addr("ipc",0x40,test_ipc_ping_pong_many::nuts_addr_);
  nVar2 = nng_pair1_open((nng_socket *)&sz_);
  pcVar5 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                         ,0xb5,"%s: expected success, got %s (%d)","nng_pair1_open(&(s0))",pcVar5,
                         nVar2);
  if (iVar3 != 0) {
    nVar2 = nng_pair1_open((nng_socket *)((long)&sz_ + 4));
    pcVar5 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                           ,0xb6,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar5,
                           nVar2);
    if (iVar3 != 0) {
      nVar2 = nng_socket_set_ms(sz_._0_4_,"recv-timeout",100);
      pcVar5 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                             ,0xb7,"%s: expected success, got %s (%d)",
                             "nng_socket_set_ms(s0, NNG_OPT_RECVTIMEO, 100)",pcVar5,nVar2);
      if (iVar3 != 0) {
        nVar2 = nng_socket_set_ms(sz_._0_4_,"send-timeout",100);
        pcVar5 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                               ,0xb8,"%s: expected success, got %s (%d)",
                               "nng_socket_set_ms(s0, NNG_OPT_SENDTIMEO, 100)",pcVar5,nVar2);
        if (iVar3 != 0) {
          nVar2 = nng_socket_set_ms(sz_._4_4_,"recv-timeout",100);
          pcVar5 = nng_strerror(nVar2);
          iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                                 ,0xb9,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100)",pcVar5,nVar2);
          if (iVar3 != 0) {
            nVar2 = nng_socket_set_ms(sz_._4_4_,"send-timeout",100);
            pcVar5 = nng_strerror(nVar2);
            iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                                   ,0xba,"%s: expected success, got %s (%d)",
                                   "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100)",pcVar5,nVar2);
            if (iVar3 != 0) {
              nVar2 = nuts_marry_ex(sz_._0_4_,sz_._4_4_,test_ipc_ping_pong_many::nuts_addr_,
                                    (nng_pipe *)0x0,(nng_pipe *)0x0);
              pcVar5 = nng_strerror(nVar2);
              iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                                     ,0xbc,"%s: expected success, got %s (%d)",
                                     "nuts_marry_ex(s0, s1, addr, ((void*)0), ((void*)0))",pcVar5,
                                     nVar2);
              if (iVar3 != 0) {
                iVar3 = 100;
                do {
                  buf_._60_4_ = iVar3;
                  nVar2 = nng_send(sz_._0_4_,"ping",5,0);
                  pcVar5 = nng_strerror(nVar2);
                  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                                         ,0xbf,"%s: expected success, got %s (%d)",
                                         "nng_send(s0, \"ping\", strlen(\"ping\") + 1, 0)",pcVar5,
                                         nVar2);
                  if (iVar3 == 0) goto LAB_0010d3a2;
                  local_40 = 0x40;
                  nVar4 = nng_recv(sz_._4_4_,&local_88,&local_40,0);
                  pcVar5 = nng_strerror(nVar4);
                  acutest_check_((uint)(nVar4 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                                 ,0xc0,"nng_recv (%d %s)",(ulong)nVar4,pcVar5,nVar2);
                  acutest_check_((uint)(local_40 == 5),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                                 ,0xc0,"length %d want %d",local_40,5);
                  buf_[0x37] = '\0';
                  acutest_check_((uint)(local_84 == '\0' && local_88 == 0x676e6970),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                                 ,0xc0,"%s == %s","ping");
                  nVar2 = nng_send(sz_._4_4_,"pong",5,0);
                  pcVar5 = nng_strerror(nVar2);
                  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                                         ,0xc1,"%s: expected success, got %s (%d)",
                                         "nng_send(s1, \"pong\", strlen(\"pong\") + 1, 0)",pcVar5,
                                         nVar2);
                  uVar1 = buf_._60_4_;
                  if (iVar3 == 0) goto LAB_0010d3a2;
                  local_40 = 0x40;
                  nVar4 = nng_recv(sz_._0_4_,&local_88,&local_40,0);
                  pcVar5 = nng_strerror(nVar4);
                  acutest_check_((uint)(nVar4 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                                 ,0xc2,"nng_recv (%d %s)",(ulong)nVar4,pcVar5,nVar2);
                  acutest_check_((uint)(local_40 == 5),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                                 ,0xc2,"length %d want %d",local_40,5);
                  buf_[0x37] = '\0';
                  acutest_check_((uint)(local_84 == '\0' && local_88 == 0x676e6f70),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                                 ,0xc2,"%s == %s","pong",&local_88);
                  iVar3 = uVar1 + -1;
                } while (iVar3 != 0);
                nVar2 = nng_socket_close(sz_._0_4_);
                pcVar5 = nng_strerror(nVar2);
                iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                                       ,0xc4,"%s: expected success, got %s (%d)",
                                       "nng_socket_close(s0)",pcVar5,nVar2);
                if (iVar3 != 0) {
                  nVar2 = nng_socket_close(sz_._4_4_);
                  pcVar5 = nng_strerror(nVar2);
                  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                                         ,0xc5,"%s: expected success, got %s (%d)",
                                         "nng_socket_close(s1)",pcVar5,nVar2);
                  if (iVar3 != 0) {
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010d3a2:
  acutest_abort_();
}

Assistant:

void
test_ipc_ping_pong_many(void)
{
	nng_socket s0;
	nng_socket s1;
	char      *addr;

	NUTS_ADDR(addr, "ipc");
	NUTS_OPEN(s0);
	NUTS_OPEN(s1);
	NUTS_PASS(nng_socket_set_ms(s0, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s0, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100));

	NUTS_MARRY_EX(s0, s1, addr, NULL, NULL);

	for (int i = 0; i < 100; i++) {
		NUTS_SEND(s0, "ping");
		NUTS_RECV(s1, "ping");
		NUTS_SEND(s1, "pong");
		NUTS_RECV(s0, "pong");
	}
	NUTS_CLOSE(s0);
	NUTS_CLOSE(s1);
}